

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

void __thiscall FfsParser::FfsParser(FfsParser *this,TreeModel *treeModel)

{
  FitParser *pFVar1;
  NvramParser *pNVar2;
  MeParser *pMVar3;
  
  this->model = treeModel;
  (this->messagesVector).
  super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messagesVector).
  super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messagesVector).
  super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->openedImage).d._M_dataplus._M_p = (pointer)&(this->openedImage).d.field_2;
  (this->openedImage).d._M_string_length = 0;
  (this->openedImage).d.field_2._M_local_buf[0] = '\0';
  (this->lastVtf).r = -1;
  (this->lastVtf).c = -1;
  this->imageBase = 0;
  (this->lastVtf).i = 0;
  (this->lastVtf).m = (TreeModel *)0x0;
  this->addressDiff = 0x100000000;
  Bstrlib::CBString::CBString(&this->securityInfo);
  (this->protectedRanges).super__Vector_base<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->protectedRegionsBase = 0;
  (this->protectedRanges).super__Vector_base<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->protectedRanges).super__Vector_base<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dxeCore).r = -1;
  (this->dxeCore).c = -1;
  (this->dxeCore).i = 0;
  (this->dxeCore).m = (TreeModel *)0x0;
  pFVar1 = (FitParser *)operator_new(1);
  this->fitParser = pFVar1;
  pNVar2 = (NvramParser *)operator_new(1);
  this->nvramParser = pNVar2;
  pMVar3 = (MeParser *)operator_new(1);
  this->meParser = pMVar3;
  return;
}

Assistant:

FfsParser::FfsParser(TreeModel* treeModel) : model(treeModel),
imageBase(0), addressDiff(0x100000000ULL), protectedRegionsBase(0) {
    fitParser = new FitParser(treeModel, this);
    nvramParser = new NvramParser(treeModel, this);
    meParser = new MeParser(treeModel, this);
}